

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O3

CompiledFilter __thiscall
Rml::FilterDropShadow::CompileFilter(FilterDropShadow *this,Element *element)

{
  Vector2f value;
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long uVar1;
  Variant *this_00;
  long lVar2;
  CompiledFilter CVar3;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_1de;
  key_compare local_1dd;
  float local_1dc;
  undefined1 local_1d8 [32];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_1b8;
  Variant local_1a0;
  float local_178;
  float local_168;
  Variant local_158;
  Variant local_130;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_108;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_78;
  
  local_1dc = Element::ResolveLength
                        (in_RDX,*(NumericValue *)
                                 ((long)&(element->children).
                                         super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4));
  local_168 = Element::ResolveLength
                        (in_RDX,*(NumericValue *)
                                 ((long)&(element->super_EnableObserverPtr<Rml::Element>).block + 4)
                        );
  local_178 = Element::ResolveLength(in_RDX,*(NumericValue *)&element->visible);
  name = Element::GetRenderManager(in_RDX);
  local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"drop-shadow","");
  local_1a0.type = NONE;
  Variant::Set(&local_1a0,*(Colourb *)&(element->super_EnableObserverPtr<Rml::Element>).block);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_108,(char (*) [6])0x2d6895,&local_1a0);
  local_130.type = NONE;
  value.y = local_178;
  value.x = local_168;
  Variant::Set(&local_130,value);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_c0,(char (*) [7])"offset",&local_130);
  local_158.type = NONE;
  Variant::Set(&local_158,local_1dc);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_78,(char (*) [6])0x2d67c5,&local_158);
  init._M_len = 3;
  init._M_array = &local_108;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_1b8,init,&local_1dd,&local_1de);
  RenderManager::CompileFilter((RenderManager *)this,(String *)name,(Dictionary *)local_1d8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_1b8.m_container);
  lVar2 = -0xd8;
  this_00 = &local_78.second;
  do {
    Variant::~Variant(this_00);
    if ((long *)(this_00[-1].data + 0x10) != *(long **)this_00[-1].data) {
      operator_delete(*(long **)this_00[-1].data,*(long *)(this_00[-1].data + 0x10) + 1);
    }
    this_00 = (Variant *)this_00[-2].data;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0);
  Variant::~Variant(&local_158);
  Variant::~Variant(&local_130);
  Variant::~Variant(&local_1a0);
  uVar1 = extraout_RDX;
  if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1d8._16_8_)->_M_dataplus)._M_p + 1));
    uVar1 = extraout_RDX_00;
  }
  CVar3.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle = uVar1;
  CVar3.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar3.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterDropShadow::CompileFilter(Element* element) const
{
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	CompiledFilter filter = element->GetRenderManager()->CompileFilter("drop-shadow",
		Dictionary{{"color", Variant(color)}, {"offset", Variant(offset)}, {"sigma", Variant(sigma)}});

	return filter;
}